

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
          (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this,
          size_t pos)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  StringPtr *pSVar2;
  HashBucket *pHVar3;
  StringPtr *pSVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t in_RCX;
  StringPtr *in_R8;
  uint uVar8;
  size_t sVar9;
  ArrayPtr<kj::StringPtr> table;
  ArrayPtr<const_unsigned_char> s;
  char *local_38;
  size_t sStack_30;
  
  pSVar2 = (this->rows).builder.ptr + pos;
  local_38 = (pSVar2->content).ptr;
  sStack_30 = (pSVar2->content).size_;
  table.size_ = (size_t)&local_38;
  table.ptr = (StringPtr *)pos;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::erase<kj::StringPtr,kj::StringPtr>
            (&this->indexes,table,in_RCX,in_R8);
  pSVar2 = (this->rows).builder.ptr;
  sVar9 = ((long)(this->rows).builder.pos - (long)pSVar2 >> 4) - 1;
  if (sVar9 != pos) {
    s.size_ = pSVar2[sVar9].content.size_ - 1;
    s.ptr = (uchar *)pSVar2[sVar9].content.ptr;
    uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    uVar5 = _::chooseBucket(uVar5,(uint)(this->indexes).buckets.size_);
    pHVar3 = (this->indexes).buckets.ptr;
    uVar8 = (int)sVar9 + 2;
    uVar6 = (ulong)uVar5;
    uVar5 = pHVar3[uVar6].value;
    if (uVar8 != uVar5) {
      do {
        if (uVar5 == 0) {
          _::logHashTableInconsistency();
          goto LAB_00145ac6;
        }
        uVar7 = uVar6 + 1;
        uVar6 = uVar7 & 0xffffffff;
        if (uVar7 == (this->indexes).buckets.size_) {
          uVar6 = 0;
        }
        uVar5 = pHVar3[uVar6].value;
      } while (uVar8 != uVar5);
    }
    pHVar3[uVar6].value = (int)pos + 2;
LAB_00145ac6:
    pSVar4 = (this->rows).builder.ptr;
    pSVar2 = pSVar4 + sVar9;
    sVar9 = (pSVar2->content).size_;
    pSVar4 = pSVar4 + pos;
    (pSVar4->content).ptr = (pSVar2->content).ptr;
    (pSVar4->content).size_ = sVar9;
  }
  ppRVar1 = &(this->rows).builder.pos;
  *ppRVar1 = *ppRVar1 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}